

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::
addEvent<std::deque<int,std::allocator<int>>&,std::__cxx11::list<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          deque<int,_std::allocator<int>_> *args,list<int,_std::allocator<int>_> *args_1,
          vector<bool,_std::allocator<bool>_> *args_2)

{
  undefined1 uVar1;
  size_t in_RDX;
  SessionWriter *in_RSI;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [5];
  size_t sizes [5];
  size_t size;
  QueueWriter *in_stack_fffffffffffffee8;
  QueueWriter *ostream;
  deque<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  vector<bool,_std::allocator<bool>_> *in;
  size_t in_stack_ffffffffffffff08;
  undefined4 *puVar2;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined1 local_98 [8];
  long local_90;
  _Bit_type *local_88;
  unsigned_long *local_80;
  unsigned_long *local_78;
  unsigned_long *local_70;
  unsigned_long local_68 [2];
  size_t local_58;
  size_t local_50;
  size_t local_48;
  unsigned_long local_40 [4];
  
  local_40[0] = 0;
  local_68[0] = 8;
  local_68[1] = 8;
  local_58 = mserialize::serialized_size<std::deque<int,std::allocator<int>>>
                       ((deque<int,_std::allocator<int>_> *)0x113752);
  local_50 = mserialize::serialized_size<std::__cxx11::list<int,std::allocator<int>>>
                       ((list<int,_std::allocator<int>_> *)0x113780);
  local_48 = mserialize::serialized_size<std::vector<bool,std::allocator<bool>>>
                       ((vector<bool,_std::allocator<bool>_> *)0x1137ae);
  local_80 = local_40;
  local_70 = local_68;
  for (local_78 = local_70; local_78 != local_80; local_78 = local_78 + 1) {
    local_88 = (_Bit_type *)*local_78;
    local_40[0] = (long)local_88 + local_40[0];
  }
  local_90 = local_40[0] + 4;
  uVar1 = detail::QueueWriter::beginWrite
                    ((QueueWriter *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     in_stack_ffffffffffffff08);
  if (!(bool)uVar1) {
    replaceChannel(in_RSI,in_RDX);
    in_stack_ffffffffffffff16 =
         detail::QueueWriter::beginWrite
                   ((QueueWriter *)
                    CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                    in_stack_ffffffffffffff08);
    if (!(bool)in_stack_ffffffffffffff16) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  puVar2 = &local_a4;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            ((unsigned_long *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *puVar2 = 0;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            ((unsigned_long *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_a0 = 0;
  mserialize::serialize<std::deque<int,std::allocator<int>>,binlog::detail::QueueWriter>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_9c = 0;
  in = (vector<bool,_std::allocator<bool>_> *)local_98;
  mserialize::serialize<std::__cxx11::list<int,std::allocator<int>>,binlog::detail::QueueWriter>
            ((list<int,_std::allocator<int>_> *)in,in_stack_fffffffffffffee8);
  *(undefined4 *)
   &((_List_node_base *)
    &(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start)->
    _M_next = 0;
  ostream = (QueueWriter *)(local_98 + 4);
  mserialize::serialize<std::vector<bool,std::allocator<bool>>,binlog::detail::QueueWriter>
            (in,ostream);
  *(undefined4 *)&ostream->_queue = 0;
  detail::QueueWriter::endWrite
            ((QueueWriter *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}